

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrument.cpp
# Opt level: O2

void __thiscall
sf2cute::SFInstrument::RemoveZoneIf
          (SFInstrument *this,
          function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
          *predicate)

{
  __uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
  *p_Var1;
  bool bVar2;
  long lVar3;
  __uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
  *p_Var4;
  const_iterator __first;
  __uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
  *__args;
  long lVar5;
  
  __args = (__uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
            *)(this->zones_).
              super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  p_Var1 = (__uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
            *)(this->zones_).
              super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)p_Var1 - (long)__args;
  for (lVar5 = lVar3 >> 5; p_Var4 = __args, 0 < lVar5; lVar5 = lVar5 + -1) {
    bVar2 = std::
            function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
            ::operator()(predicate,
                         (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                          *)__args);
    if (bVar2) goto LAB_0010b276;
    bVar2 = std::
            function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
            ::operator()(predicate,
                         (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                          *)(__args + 1));
    p_Var4 = __args + 1;
    if (bVar2) goto LAB_0010b276;
    bVar2 = std::
            function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
            ::operator()(predicate,
                         (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                          *)(__args + 2));
    p_Var4 = __args + 2;
    if (bVar2) goto LAB_0010b276;
    bVar2 = std::
            function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
            ::operator()(predicate,
                         (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                          *)(__args + 3));
    p_Var4 = __args + 3;
    if (bVar2) goto LAB_0010b276;
    __args = __args + 4;
    lVar3 = lVar3 + -0x20;
  }
  lVar3 = lVar3 >> 3;
  if (lVar3 == 1) {
LAB_0010b2eb:
    bVar2 = std::
            function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
            ::operator()(predicate,
                         (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                          *)__args);
    p_Var4 = __args;
    if (!bVar2) {
      p_Var4 = p_Var1;
    }
  }
  else if (lVar3 == 2) {
LAB_0010b2d1:
    bVar2 = std::
            function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
            ::operator()(predicate,
                         (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                          *)__args);
    p_Var4 = __args;
    if (!bVar2) {
      __args = __args + 1;
      goto LAB_0010b2eb;
    }
  }
  else {
    __first._M_current =
         (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *)
         p_Var1;
    if (lVar3 != 3) goto LAB_0010b2af;
    bVar2 = std::
            function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
            ::operator()(predicate,
                         (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                          *)__args);
    if (!bVar2) {
      __args = __args + 1;
      goto LAB_0010b2d1;
    }
  }
LAB_0010b276:
  __first._M_current =
       (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_> *)
       p_Var4;
  if (p_Var4 != p_Var1) {
    while (p_Var4 = p_Var4 + 1, p_Var4 != p_Var1) {
      bVar2 = std::
              function<bool_(const_std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_&)>
              ::operator()(predicate,
                           (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                            *)p_Var4);
      if (!bVar2) {
        std::
        __uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
        ::operator=((__uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                     *)__first._M_current,p_Var4);
        __first._M_current =
             (unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
              *)((__uniq_ptr_impl<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>
                  *)__first._M_current + 1);
      }
    }
  }
LAB_0010b2af:
  std::
  vector<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
  ::erase(&this->zones_,__first,
          (this->zones_).
          super__Vector_base<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>,_std::allocator<std::unique_ptr<sf2cute::SFInstrumentZone,_std::default_delete<sf2cute::SFInstrumentZone>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void SFInstrument::RemoveZoneIf(
    std::function<bool(const std::unique_ptr<SFInstrumentZone> &)> predicate) {
  zones_.erase(std::remove_if(zones_.begin(), zones_.end(),
    [&predicate](const std::unique_ptr<SFInstrumentZone> & zone) -> bool {
    if (predicate(zone)) {
      return true;
    }
    else {
      return false;
    }
  }), zones_.end());
}